

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_alignment.cc
# Opt level: O0

bool __thiscall s2polyline_alignment::Window::IsValid(Window *this)

{
  bool bVar1;
  const_reference pvVar2;
  reference pCVar3;
  ColumnStride *curr;
  const_iterator __end1;
  const_iterator __begin1;
  vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
  *__range1;
  ColumnStride prev;
  Window *this_local;
  
  if ((((0 < this->rows_) && (0 < this->cols_)) &&
      (pvVar2 = std::
                vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
                ::front(&this->strides_), pvVar2->start == 0)) &&
     (pvVar2 = std::
               vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
               ::back(&this->strides_), pvVar2->end == this->cols_)) {
    __range1 = (vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
                *)0xffffffffffffffff;
    __end1 = std::
             vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
             ::begin(&this->strides_);
    curr = (ColumnStride *)
           std::
           vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
           ::end(&this->strides_);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<const_s2polyline_alignment::ColumnStride_*,_std::vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>_>
                                  *)&curr);
      if (!bVar1) {
        return true;
      }
      pCVar3 = __gnu_cxx::
               __normal_iterator<const_s2polyline_alignment::ColumnStride_*,_std::vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>_>
               ::operator*(&__end1);
      if (((pCVar3->end <= pCVar3->start) || (pCVar3->start < (int)__range1)) ||
         (pCVar3->end < __range1._4_4_)) break;
      __range1 = *(vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
                   **)pCVar3;
      __gnu_cxx::
      __normal_iterator<const_s2polyline_alignment::ColumnStride_*,_std::vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>_>
      ::operator++(&__end1);
    }
    return false;
  }
  return false;
}

Assistant:

bool Window::IsValid() const {
  if (rows_ <= 0 || cols_ <= 0 || strides_.front().start != 0 ||
      strides_.back().end != cols_) {
    return false;
  }

  ColumnStride prev = {-1, -1};
  for (const auto& curr : strides_) {
    if (curr.end <= curr.start || curr.start < prev.start ||
        curr.end < prev.end) {
      return false;
    }
    prev = curr;
  }
  return true;
}